

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_set_wfd(SSL *s,int fd)

{
  int iVar1;
  BIO_METHOD *type;
  BIO *b;
  
  b = s->wbio;
  if (((b == (BIO *)0x0) || (iVar1 = BIO_method_type(b), iVar1 != 0x505)) ||
     (iVar1 = BIO_get_fd((BIO *)b,(int *)0x0), iVar1 != fd)) {
    type = BIO_s_socket();
    b = BIO_new(type);
    if (b == (BIO *)0x0) {
      ERR_put_error(0x10,0,7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x5c3);
      return 0;
    }
    BIO_set_fd((BIO *)b,fd,0);
  }
  else {
    BIO_up_ref((BIO *)b);
  }
  std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&s->bbio,(pointer)b);
  return 1;
}

Assistant:

int SSL_set_wfd(SSL *ssl, int fd) {
  BIO *rbio = SSL_get_rbio(ssl);
  if (rbio == NULL || BIO_method_type(rbio) != BIO_TYPE_SOCKET ||
      BIO_get_fd(rbio, NULL) != fd) {
    BIO *bio = BIO_new(BIO_s_socket());
    if (bio == NULL) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_BUF_LIB);
      return 0;
    }
    BIO_set_fd(bio, fd, BIO_NOCLOSE);
    SSL_set0_wbio(ssl, bio);
  } else {
    // Copy the rbio over to the wbio.
    BIO_up_ref(rbio);
    SSL_set0_wbio(ssl, rbio);
  }

  return 1;
}